

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O0

clock_t __thiscall SID::clock(SID *this)

{
  uint uVar1;
  undefined8 in_RDX;
  short *in_RSI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  short *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  SID *in_stack_00000018;
  cycle_count *in_stack_00000020;
  SID *in_stack_00000028;
  int n;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  n = (int)((ulong)in_RDX >> 0x20);
  switch(this->sampling) {
  default:
    uVar1 = clock_fast((SID *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (cycle_count *)this,in_RSI,n,(int)in_RDX);
    break;
  case SAMPLE_INTERPOLATE:
    uVar1 = clock_interpolate((SID *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (cycle_count *)this,in_RSI,n,(int)in_RDX);
    break;
  case SAMPLE_RESAMPLE_INTERPOLATE:
    uVar1 = clock_resample_interpolate
                      (in_stack_00000028,in_stack_00000020,(short *)in_stack_00000018,
                       in_stack_00000014,in_stack_00000010);
    break;
  case SAMPLE_RESAMPLE_FAST:
    uVar1 = clock_resample_fast(in_stack_00000018,
                                (cycle_count *)CONCAT44(in_stack_00000014,in_stack_00000010),
                                in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  }
  return (ulong)uVar1;
}

Assistant:

int SID::clock(cycle_count& delta_t, short* buf, int n, int interleave)
{
  switch (sampling) {
  default:
  case SAMPLE_FAST:
    return clock_fast(delta_t, buf, n, interleave);
  case SAMPLE_INTERPOLATE:
    return clock_interpolate(delta_t, buf, n, interleave);
  case SAMPLE_RESAMPLE_INTERPOLATE:
    return clock_resample_interpolate(delta_t, buf, n, interleave);
  case SAMPLE_RESAMPLE_FAST:
    return clock_resample_fast(delta_t, buf, n, interleave);
  }
}